

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

Roaring64Map * doublechecked::Roaring64Map::fastunion(size_t n,Roaring64Map **inputs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  Roaring64Map *r;
  char *file;
  long in_RDX;
  ulong in_RSI;
  Roaring64Map *in_RDI;
  size_t i_1;
  Roaring64Map temp;
  Roaring64Map **in_stack_000000a0;
  size_t in_stack_000000a8;
  size_t i;
  Roaring64Map **plain_inputs;
  Roaring64Map *ans;
  int in_stack_fffffffffffffeec;
  Roaring64Map *in_stack_fffffffffffffef0;
  Roaring64Map *this;
  Roaring64Map *this_00;
  ulong local_e8;
  Roaring64Map *in_stack_ffffffffffffffb8;
  Roaring64Map *in_stack_ffffffffffffffc0;
  ulong local_28;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this_00 = in_RDI;
  r = (Roaring64Map *)operator_new__(uVar3);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    *(undefined8 *)(&(r->plain).roarings._M_t._M_impl.field_0x0 + local_28 * 8) =
         *(undefined8 *)(in_RDX + local_28 * 8);
  }
  this = (Roaring64Map *)&stack0xffffffffffffff98;
  roaring::Roaring64Map::fastunion(in_stack_000000a8,in_stack_000000a0);
  Roaring64Map(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x113541);
  if (r != (Roaring64Map *)0x0) {
    operator_delete__(r);
  }
  if (in_RSI == 0) {
    file = (char *)cardinality(this);
    _assert_true((unsigned_long)this,(char *)r,file,in_stack_fffffffffffffeec);
  }
  else {
    Roaring64Map(this_00,in_RDI);
    for (local_e8 = 1; local_e8 < in_RSI; local_e8 = local_e8 + 1) {
      operator|=(this_00,in_RDI);
    }
    bVar2 = operator==(this,r);
    _assert_true((unsigned_long)this,(char *)r,(char *)in_stack_fffffffffffffef0,
                 CONCAT13(bVar2,(int3)in_stack_fffffffffffffeec));
    ~Roaring64Map(in_stack_fffffffffffffef0);
  }
  return this_00;
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        auto plain_inputs = new const roaring::Roaring64Map *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring64Map ans(roaring::Roaring64Map::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring64Map temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }